

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoflann.hpp
# Opt level: O3

void __thiscall
nanoflann::
KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
::computeMinMax(KDTreeBaseClass<nanoflann::KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>,_nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                *this,KDTreeSingleIndexAdaptor<nanoflann::L2_Simple_Adaptor<double,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_double>,_anurbs::PointOnSurfaceProjection<3L>::PointCloudAdaptor,_3,_unsigned_long>
                      *obj,unsigned_long *ind,unsigned_long count,int element,ElementType *min_elem,
               ElementType *max_elem)

{
  double dVar1;
  pointer pPVar2;
  unsigned_long uVar3;
  double dVar4;
  
  if ((uint)element < 3) {
    pPVar2 = (obj->dataset->m_points->
             super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
             )._M_impl.super__Vector_impl_data._M_start;
    dVar4 = *(double *)
             ((long)&pPVar2[*ind].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
                     .m_storage + (ulong)(uint)element * 8);
    *min_elem = dVar4;
    *max_elem = dVar4;
    if (1 < count) {
      uVar3 = 1;
      do {
        dVar1 = *(double *)
                 ((long)&pPVar2[ind[uVar3]].point.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage +
                 (ulong)(uint)element * 8);
        if (dVar1 < *min_elem) {
          *min_elem = dVar1;
          dVar4 = *max_elem;
        }
        if (dVar4 < dVar1) {
          *max_elem = dVar1;
          dVar4 = dVar1;
        }
        uVar3 = uVar3 + 1;
      } while (count != uVar3);
    }
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xa2,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, 1, 3>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, 1, 3>, Level = 0]"
               );
}

Assistant:

void computeMinMax(const Derived &obj, IndexType *ind, IndexType count,
                     int element, ElementType &min_elem,
                     ElementType &max_elem) {
    min_elem = dataset_get(obj, ind[0], element);
    max_elem = dataset_get(obj, ind[0], element);
    for (IndexType i = 1; i < count; ++i) {
      ElementType val = dataset_get(obj, ind[i], element);
      if (val < min_elem)
        min_elem = val;
      if (val > max_elem)
        max_elem = val;
    }
  }